

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall
PSVIWriterHandlers::writeEmpty(PSVIWriterHandlers *this,XMLCh *elementName,StringList *attrs)

{
  XMLFormatter *pXVar1;
  XMLSize_t XVar2;
  char16_t *pcVar3;
  uint local_24;
  uint i;
  StringList *attrs_local;
  XMLCh *elementName_local;
  PSVIWriterHandlers *this_local;
  
  pXVar1 = xercesc_4_0::XMLFormatter::operator<<(this->fFormatter,NoEscapes);
  pXVar1 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar1,this->fIndentChars);
  pXVar1 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar1,L'<');
  xercesc_4_0::XMLFormatter::operator<<(pXVar1,elementName);
  local_24 = 0;
  while( true ) {
    XVar2 = xercesc_4_0::BaseRefVectorOf<char16_t>::size(&attrs->super_BaseRefVectorOf<char16_t>);
    if (XVar2 <= local_24) break;
    pXVar1 = xercesc_4_0::XMLFormatter::operator<<(this->fFormatter,NoEscapes);
    pXVar1 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar1,L' ');
    pcVar3 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                       (&attrs->super_BaseRefVectorOf<char16_t>,(ulong)local_24);
    pXVar1 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar1,pcVar3);
    pXVar1 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar1,L"=\"");
    pXVar1 = xercesc_4_0::XMLFormatter::operator<<(pXVar1,AttrEscapes);
    pcVar3 = xercesc_4_0::BaseRefVectorOf<char16_t>::elementAt
                       (&attrs->super_BaseRefVectorOf<char16_t>,(ulong)(local_24 + 1));
    pXVar1 = (XMLFormatter *)xercesc_4_0::XMLFormatter::operator<<(pXVar1,pcVar3);
    pXVar1 = xercesc_4_0::XMLFormatter::operator<<(pXVar1,NoEscapes);
    xercesc_4_0::XMLFormatter::operator<<(pXVar1,L'\"');
    local_24 = local_24 + 2;
  }
  pXVar1 = xercesc_4_0::XMLFormatter::operator<<(this->fFormatter,NoEscapes);
  xercesc_4_0::XMLFormatter::operator<<(pXVar1,L"/>\n");
  return;
}

Assistant:

void PSVIWriterHandlers::writeEmpty(const XMLCh* const elementName, const StringList* const attrs) {
	*fFormatter
		<< XMLFormatter::NoEscapes << fIndentChars << chOpenAngle << elementName ;
	for (unsigned int i=0; i < attrs->size(); i+=2 ) {
		*fFormatter
			<< XMLFormatter::NoEscapes << chSpace << attrs->elementAt(i) << gEqualsQuote
			<< XMLFormatter::AttrEscapes << attrs->elementAt(i+1)
			<< XMLFormatter::NoEscapes << chDoubleQuote ;
	}
	*fFormatter
		<< XMLFormatter::NoEscapes << gSlashAngleFeed ;
}